

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widget.cpp
# Opt level: O0

void __thiscall polyscope::Widget::Widget(Widget *this)

{
  vector<polyscope::WeakHandle<polyscope::Widget>,_std::allocator<polyscope::WeakHandle<polyscope::Widget>_>_>
  *in_RDI;
  Widget *in_stack_00000020;
  WeakReferrable *in_stack_00000028;
  value_type *in_stack_ffffffffffffffb8;
  WeakReferrable *in_stack_ffffffffffffffe0;
  
  WeakReferrable::WeakReferrable(in_stack_ffffffffffffffe0);
  (in_RDI->
  super__Vector_base<polyscope::WeakHandle<polyscope::Widget>,_std::allocator<polyscope::WeakHandle<polyscope::Widget>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__Widget_0098b8d8;
  (in_RDI->
  super__Vector_base<polyscope::WeakHandle<polyscope::Widget>,_std::allocator<polyscope::WeakHandle<polyscope::Widget>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)&PTR__Widget_0098b918;
  WeakReferrable::getWeakHandle<polyscope::Widget>(in_stack_00000028,in_stack_00000020);
  std::
  vector<polyscope::WeakHandle<polyscope::Widget>,_std::allocator<polyscope::WeakHandle<polyscope::Widget>_>_>
  ::push_back(in_RDI,in_stack_ffffffffffffffb8);
  WeakHandle<polyscope::Widget>::~WeakHandle((WeakHandle<polyscope::Widget> *)0x3ee920);
  return;
}

Assistant:

Widget::Widget() { state::widgets.push_back(getWeakHandle<Widget>(this)); }